

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-reduce.cpp
# Opt level: O0

void __thiscall Reducer::handleCondition(Reducer *this,Expression **condition)

{
  bool bVar1;
  pointer this_00;
  Literal local_38;
  Const *local_20;
  Const *c;
  Expression **condition_local;
  Reducer *this_local;
  
  if ((*condition != (Expression *)0x0) &&
     (c = (Const *)condition, condition_local = (Expression **)this,
     bVar1 = wasm::Expression::is<wasm::Const>(*condition), !bVar1)) {
    this_00 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                        (&this->builder);
    local_20 = wasm::Builder::makeConst<int>(this_00,0);
    bVar1 = tryToReplaceChild(this,(Expression **)c,(Expression *)local_20);
    if (!bVar1) {
      wasm::Literal::Literal(&local_38,1);
      wasm::Literal::operator=(&local_20->value,&local_38);
      wasm::Literal::~Literal(&local_38);
      tryToReplaceChild(this,(Expression **)c,(Expression *)local_20);
    }
  }
  return;
}

Assistant:

void handleCondition(Expression*& condition) {
    if (!condition) {
      return;
    }
    if (condition->is<Const>()) {
      return;
    }
    auto* c = builder->makeConst(int32_t(0));
    if (!tryToReplaceChild(condition, c)) {
      c->value = Literal(int32_t(1));
      tryToReplaceChild(condition, c);
    }
  }